

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.hpp
# Opt level: O1

InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
duckdb::PhysicalOperator::ExtraSourceParams_abi_cxx11_
          (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,PhysicalOperator *this,GlobalSourceState *gstate,
          LocalSourceState *lstate)

{
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_buckets =
       &(__return_storage_ptr__->map_idx)._M_h._M_single_bucket;
  (__return_storage_ptr__->map_idx)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->map_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_element_count = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return __return_storage_ptr__;
}

Assistant:

virtual InsertionOrderPreservingMap<string> ExtraSourceParams(GlobalSourceState &gstate,
	                                                              LocalSourceState &lstate) const {
		return InsertionOrderPreservingMap<string>();
	}